

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

ImageViewWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateImageView
          (ImageViewWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkImageViewCreateInfo *ImageViewCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (ImageViewCI->sType != VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO) {
    Diligent::FormatString<char[26],char[62]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageViewCI.sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO",
               (char (*) [62])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xd4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkImageView_T*,(VulkanUtilities::VulkanHandleTypeId)5,VkResult(*)(VkDevice_T*,VkImageViewCreateInfo_const*,VkAllocationCallbacks_const*,VkImageView_T**),VkImageViewCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkImageViewCreateInfo_ptr_VkAllocationCallbacks_ptr_VkImageView_T_ptr_ptr
              *)vkCreateImageView,ImageViewCI,DebugName,"image view");
  return __return_storage_ptr__;
}

Assistant:

ImageViewWrapper VulkanLogicalDevice::CreateImageView(const VkImageViewCreateInfo& ImageViewCI,
                                                      const char*                  DebugName) const
{
    VERIFY_EXPR(ImageViewCI.sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO);
    return CreateVulkanObject<VkImageView, VulkanHandleTypeId::ImageView>(vkCreateImageView, ImageViewCI, DebugName, "image view");
}